

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS ref_mpi_create(REF_MPI *ref_mpi_ptr)

{
  uint uVar1;
  void *in_RSI;
  
  uVar1 = ref_mpi_create_from_comm(ref_mpi_ptr,in_RSI);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x83,
           "ref_mpi_create",(ulong)uVar1,"create from NULL comm");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_create(REF_MPI *ref_mpi_ptr) {
#ifdef HAVE_MPI
  MPI_Comm comm = MPI_COMM_WORLD;
  RSS(ref_mpi_create_from_comm(ref_mpi_ptr, (void *)(&(comm))),
      "create from MPI_WORLD_COMM");
#else
  RSS(ref_mpi_create_from_comm(ref_mpi_ptr, NULL), "create from NULL comm");
#endif

  return REF_SUCCESS;
}